

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O2

void __thiscall adios2::core::engine::CampaignManager::Close(CampaignManager *this)

{
  string *psVar1;
  string sStack_38;
  
  if ((this->cmap)._M_h._M_element_count != 0) {
    helper::CreateDirectory(&this->m_CampaignDir);
    psVar1 = &this->m_Name;
    std::__cxx11::string::string((string *)&sStack_38,(string *)psVar1);
    CMapToSqlite(&this->cmap,(int)psVar1,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  this->m_Opened = false;
  return;
}

Assistant:

void CampaignManager::Close()
{
    if (!cmap.empty())
    {
        helper::CreateDirectory(m_CampaignDir);
        CMapToSqlite(cmap, m_WriterRank, m_Name);
    }
    m_Opened = false;
}